

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Node::AddP70numberA(Node *this,string *name,double value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [8];
  Node n;
  double value_local;
  string *name_local;
  Node *this_local;
  
  n.property_start = (size_t)value;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"P",&local_b1);
  Node((Node *)local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::string((string *)&local_e8,(string *)name);
  AddProperties<std::__cxx11::string,char_const*,char_const*,char_const*,double>
            ((Node *)local_90,&local_e8,"Number","","A",(double)n.property_start);
  std::__cxx11::string::~string((string *)&local_e8);
  AddChild(this,(Node *)local_90);
  ~Node((Node *)local_90);
  return;
}

Assistant:

void FBX::Node::AddP70numberA(
    const std::string& name, double value
) {
    FBX::Node n("P");
    n.AddProperties(name, "Number", "", "A", value);
    AddChild(n);
}